

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int yaml_emitter_process_anchor(yaml_emitter_t *emitter)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  char *indicator;
  byte *pbVar5;
  byte *pbVar6;
  
  if ((emitter->anchor_data).anchor == (yaml_char_t *)0x0) {
    iVar4 = 1;
  }
  else {
    indicator = "*";
    if ((emitter->anchor_data).alias == 0) {
      indicator = "&";
    }
    iVar4 = 1;
    iVar3 = yaml_emitter_write_indicator(emitter,indicator,1,0,0);
    if (iVar3 == 0) {
LAB_00109552:
      iVar4 = 0;
    }
    else {
      pbVar6 = (emitter->anchor_data).anchor;
      pbVar5 = pbVar6 + (emitter->anchor_data).anchor_length;
      while (pbVar6 != pbVar5) {
        if ((emitter->buffer).end <= (emitter->buffer).pointer + 5) {
          iVar3 = yaml_emitter_flush(emitter);
          if (iVar3 == 0) goto LAB_00109552;
        }
        bVar2 = *pbVar6;
        if ((char)bVar2 < '\0') {
          if ((bVar2 & 0xe0) == 0xc0) {
            pbVar1 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar1 + 1;
            *pbVar1 = bVar2;
            bVar2 = pbVar6[1];
            pbVar6 = pbVar6 + 2;
            goto LAB_00109533;
          }
          if ((bVar2 & 0xf0) == 0xe0) {
            pbVar1 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar1 + 1;
            *pbVar1 = bVar2;
            bVar2 = pbVar6[1];
            pbVar1 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar1 + 1;
            *pbVar1 = bVar2;
            bVar2 = pbVar6[2];
            pbVar6 = pbVar6 + 3;
            goto LAB_00109533;
          }
          if ((bVar2 & 0xf8) == 0xf0) {
            pbVar1 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar1 + 1;
            *pbVar1 = bVar2;
            bVar2 = pbVar6[1];
            pbVar1 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar1 + 1;
            *pbVar1 = bVar2;
            bVar2 = pbVar6[2];
            pbVar1 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar1 + 1;
            *pbVar1 = bVar2;
            bVar2 = pbVar6[3];
            pbVar6 = pbVar6 + 4;
            goto LAB_00109533;
          }
        }
        else {
          pbVar6 = pbVar6 + 1;
LAB_00109533:
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
        }
        emitter->column = emitter->column + 1;
      }
      emitter->whitespace = 0;
      emitter->indention = 0;
    }
  }
  return iVar4;
}

Assistant:

static int
yaml_emitter_process_anchor(yaml_emitter_t *emitter)
{
    if (!emitter->anchor_data.anchor)
        return 1;

    if (!yaml_emitter_write_indicator(emitter,
                (emitter->anchor_data.alias ? "*" : "&"), 1, 0, 0))
        return 0;

    return yaml_emitter_write_anchor(emitter,
            emitter->anchor_data.anchor, emitter->anchor_data.anchor_length);
}